

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O0

void __thiscall TestClass::ProcessFunc3(TestClass *this,Event3 *ev)

{
  undefined1 local_28 [4];
  int elapsed;
  timeval curTime;
  Event3 *ev_local;
  TestClass *this_local;
  
  curTime.tv_usec = (__suseconds_t)ev;
  TimeUtils::getCurTime((timeval *)local_28);
  TimeUtils::getDifference((timeval *)local_28,(timeval *)(curTime.tv_usec + 0x20));
  return;
}

Assistant:

void TestClass::ProcessFunc3( Event3 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	LOG_NOTICE( "Timer %p with tick time %d, elapsed is %d\n",
				ev->mTimer, ev->mTimer->getTickTime(), elapsed );
}